

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_30::AsyncStreamFd::tryReadInternal
          (AsyncStreamFd *this,void *buffer,size_t minBytes,size_t maxBytes,size_t alreadyRead)

{
  int osErrorNumber;
  void *pvVar1;
  unsigned_long uVar2;
  NullableValue<bool> *other;
  bool *pbVar3;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *extraout_RDX_02;
  PromiseNode *extraout_RDX_03;
  PromiseNode *pPVar4;
  FixVoid<unsigned_long> in_R9;
  Promise<unsigned_long> PVar5;
  void *local_f8;
  char *local_f0;
  size_t local_e8;
  size_t local_e0;
  char *local_d8;
  undefined1 local_d0 [19];
  undefined1 local_bd [2];
  NullableValue<bool> local_bb;
  NullableValue<bool> atEnd;
  PromiseFulfiller<void> *pPStack_b8;
  undefined1 local_90 [40];
  Fault f;
  SyscallResult local_44;
  undefined1 auStack_40 [4];
  SyscallResult _kjSyscallResult;
  ssize_t n;
  size_t alreadyRead_local;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  AsyncStreamFd *this_local;
  
  f.exception = (Exception *)auStack_40;
  local_44 = _::Debug::
             syscall<kj::(anonymous_namespace)::AsyncStreamFd::tryReadInternal(void*,unsigned_long,unsigned_long,unsigned_long)::_lambda()_1_>
                       ((anon_class_32_4_f0ba1e86 *)&f,true);
  pvVar1 = _::Debug::SyscallResult::operator_cast_to_void_(&local_44);
  if (pvVar1 == (void *)0x0) {
    osErrorNumber = _::Debug::SyscallResult::getErrorNumber(&local_44);
    _::Debug::Fault::Fault
              ((Fault *)(local_90 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x139,osErrorNumber,"n = ::read(fd, buffer, maxBytes)","");
    local_90._16_4_ = 5;
    _::Debug::Fault::~Fault((Fault *)(local_90 + 0x20));
    Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,in_R9);
    pPVar4 = extraout_RDX;
  }
  else if ((long)_auStack_40 < 0) {
    UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_90);
    pPStack_b8 = (PromiseFulfiller<void> *)buffer;
    Promise<void>::
    then<kj::(anonymous_namespace)::AsyncStreamFd::tryReadInternal(void*,unsigned_long,unsigned_long,unsigned_long)::_lambda()_2_,kj::_::PropagateException>
              ((Promise<void> *)this,(Type *)local_90,(PropagateException *)&stack0xffffffffffffff48
              );
    Promise<void>::~Promise((Promise<void> *)local_90);
    pPVar4 = extraout_RDX_00;
  }
  else if (_auStack_40 == (char *)0x0) {
    Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,in_R9);
    pPVar4 = extraout_RDX_01;
  }
  else {
    uVar2 = implicitCast<unsigned_long,long&>((long *)auStack_40);
    if (uVar2 < maxBytes) {
      UnixEventPort::FdObserver::atEndHint((FdObserver *)local_bd);
      other = _::readMaybe<bool>((Maybe<bool> *)local_bd);
      _::NullableValue<bool>::NullableValue((NullableValue<bool> *)(local_bd + 2),other);
      Maybe<bool>::~Maybe((Maybe<bool> *)local_bd);
      pbVar3 = _::NullableValue::operator_cast_to_bool_((NullableValue *)(local_bd + 2));
      if (pbVar3 == (bool *)0x0) {
        tryReadInternal(this,buffer,(size_t)(_auStack_40 + minBytes),maxBytes - (long)_auStack_40,
                        alreadyRead - (long)_auStack_40);
      }
      else {
        pbVar3 = _::NullableValue<bool>::operator*((NullableValue<bool> *)(local_bd + 2));
        if ((*pbVar3 & 1U) == 0) {
          UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_d0);
          local_f8 = buffer;
          local_f0 = _auStack_40 + minBytes;
          local_e8 = maxBytes - (long)_auStack_40;
          local_e0 = alreadyRead - (long)_auStack_40;
          local_d8 = _auStack_40 + in_R9;
          Promise<void>::
          then<kj::(anonymous_namespace)::AsyncStreamFd::tryReadInternal(void*,unsigned_long,unsigned_long,unsigned_long)::_lambda()_3_,kj::_::PropagateException>
                    ((Promise<void> *)this,(Type *)local_d0,(PropagateException *)&local_f8);
          Promise<void>::~Promise((Promise<void> *)local_d0);
        }
        else {
          Promise<unsigned_long>::Promise
                    ((Promise<unsigned_long> *)this,(FixVoid<unsigned_long>)(_auStack_40 + in_R9));
        }
      }
      local_90._16_4_ = 1;
      _::NullableValue<bool>::~NullableValue((NullableValue<bool> *)(local_bd + 2));
      pPVar4 = extraout_RDX_03;
    }
    else {
      Promise<unsigned_long>::Promise
                ((Promise<unsigned_long> *)this,(FixVoid<unsigned_long>)(_auStack_40 + in_R9));
      pPVar4 = extraout_RDX_02;
    }
  }
  PVar5.super_PromiseBase.node.ptr = pPVar4;
  PVar5.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar5.super_PromiseBase.node;
}

Assistant:

Promise<size_t> tryReadInternal(void* buffer, size_t minBytes, size_t maxBytes,
                                  size_t alreadyRead) {
    // `alreadyRead` is the number of bytes we have already received via previous reads -- minBytes,
    // maxBytes, and buffer have already been adjusted to account for them, but this count must
    // be included in the final return value.

    ssize_t n;
    KJ_NONBLOCKING_SYSCALL(n = ::read(fd, buffer, maxBytes)) {
      // Error.

      // We can't "return kj::READY_NOW;" inside this block because it causes a memory leak due to
      // a bug that exists in both Clang and GCC:
      //   http://gcc.gnu.org/bugzilla/show_bug.cgi?id=33799
      //   http://llvm.org/bugs/show_bug.cgi?id=12286
      goto error;
    }
    if (false) {
    error:
      return alreadyRead;
    }

    if (n < 0) {
      // Read would block.
      return observer.whenBecomesReadable().then([=]() {
        return tryReadInternal(buffer, minBytes, maxBytes, alreadyRead);
      });
    } else if (n == 0) {
      // EOF -OR- maxBytes == 0.
      return alreadyRead;
    } else if (implicitCast<size_t>(n) >= minBytes) {
      // We read enough to stop here.
      return alreadyRead + n;
    } else {
      // The kernel returned fewer bytes than we asked for (and fewer than we need).

      buffer = reinterpret_cast<byte*>(buffer) + n;
      minBytes -= n;
      maxBytes -= n;
      alreadyRead += n;

      KJ_IF_MAYBE(atEnd, observer.atEndHint()) {
        if (*atEnd) {
          // We've already received an indication that the next read() will return EOF, so there's
          // nothing to wait for.
          return alreadyRead;
        } else {
          // As of the last time the event queue was checked, the kernel reported that we were
          // *not* at the end of the stream. It's unlikely that this has changed in the short time
          // it took to handle the event, therefore calling read() now will almost certainly fail
          // with EAGAIN. Moreover, since EOF had not been received as of the last check, we know
          // that even if it was received since then, whenBecomesReadable() will catch that. So,
          // let's go ahead and skip calling read() here and instead go straight to waiting for
          // more input.
          return observer.whenBecomesReadable().then([=]() {
            return tryReadInternal(buffer, minBytes, maxBytes, alreadyRead);
          });
        }
      } else {
        // The kernel has not indicated one way or the other whether we are likely to be at EOF.
        // In this case we *must* keep calling read() until we either get a return of zero or
        // EAGAIN.
        return tryReadInternal(buffer, minBytes, maxBytes, alreadyRead);
      }
    }